

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.cc
# Opt level: O3

bool __thiscall Worker::start(Worker *this)

{
  int iVar1;
  thread local_30;
  Worker *local_28;
  code *local_20;
  undefined8 local_18;
  
  iVar1 = this->socketfd_;
  if (iVar1 != -1) {
    this->alive_ = true;
    local_20 = work;
    local_18 = 0;
    local_28 = this;
    std::thread::thread<void(Worker::*)(),Worker*,void>
              (&local_30,(offset_in_Worker_to_subr *)&local_20,&local_28);
    if ((this->thread)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->thread)._M_id._M_thread = (native_handle_type)local_30._M_id._M_thread;
  }
  return iVar1 != -1;
}

Assistant:

bool Worker::start()
{
    if (socketfd_ != -1)
    {
        this->alive_ = true;
        this->thread = std::thread(&Worker::work, this);
        return true;
    }

    return false;
}